

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int DisconnectRPLIDAR(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  char *local_28;
  RPLIDAR *pRPLIDAR_local;
  
  iVar1 = StopRequestRPLIDAR(pRPLIDAR);
  if (iVar1 == 0) {
    SetMotorPWMRequestRPLIDAR(pRPLIDAR,0);
    iVar1 = CloseRS232Port(&pRPLIDAR->RS232Port);
    if (iVar1 == 0) {
      if (pRPLIDAR->SerialNumber[0] == '\0') {
        local_28 = "";
      }
      else {
        local_28 = " ";
      }
      printf("RPLIDAR %.32s%.1sdisconnected.\n",pRPLIDAR->SerialNumber,local_28);
      pRPLIDAR_local._4_4_ = 0;
    }
    else {
      printf("RPLIDAR disconnection failed.\n");
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  else {
    printf("Error while disconnecting a RPLIDAR.\n");
    SetMotorPWMRequestRPLIDAR(pRPLIDAR,0);
    CloseRS232Port(&pRPLIDAR->RS232Port);
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int DisconnectRPLIDAR(RPLIDAR* pRPLIDAR)
{
	if (StopRequestRPLIDAR(pRPLIDAR) != EXIT_SUCCESS)
	{
		printf("Error while disconnecting a RPLIDAR.\n");
		SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
		delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
		pRPLIDAR->drv->stopMotor();
		pRPLIDAR->drv->disconnect();
		RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
		//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
		pRPLIDAR->drv->disconnect();
		delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
		delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
		CloseRS232Port(&pRPLIDAR->RS232Port);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
		return EXIT_FAILURE;
	}

	SetMotorPWMRequestRPLIDAR(pRPLIDAR, 0);

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	delete pRPLIDAR->nodes_cache;
#ifdef FORCE_RPLIDAR_SDK_V1
	pRPLIDAR->drv->stopMotor();
	pRPLIDAR->drv->disconnect();
	RPlidarDriver::DisposeDriver(pRPLIDAR->drv); pRPLIDAR->drv = NULL;
#else
	//pRPLIDAR->drv->setMotorSpeed(0); // Not sure about what to do...
	pRPLIDAR->drv->disconnect();
	delete pRPLIDAR->channel; pRPLIDAR->channel = NULL;
	delete pRPLIDAR->drv; pRPLIDAR->drv = NULL;
#endif // FORCE_RPLIDAR_SDK_V1
#else
	if (CloseRS232Port(&pRPLIDAR->RS232Port) != EXIT_SUCCESS)
	{
		printf("RPLIDAR disconnection failed.\n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	printf("RPLIDAR %.32s%.1sdisconnected.\n", pRPLIDAR->SerialNumber, (pRPLIDAR->SerialNumber[0])? " ": "\0");

	return EXIT_SUCCESS;
}